

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O3

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::BindUnionToUnionCast
          (duckdb *this,BindCastInput *input,LogicalType *source,LogicalType *target)

{
  pointer pcVar1;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> _Var2;
  bool bVar3;
  idx_t iVar4;
  LogicalType *source_00;
  string *l1;
  idx_t iVar5;
  string *l2;
  LogicalType *target_00;
  reference pvVar6;
  ConversionException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong index;
  string message;
  vector<unsigned_long,_true> tag_map;
  string local_128;
  vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> local_108;
  __uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_> local_f0;
  idx_t local_e8;
  BindCastInput *local_e0;
  vector<unsigned_long,_true> local_d8;
  GetCastFunctionInput local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_f0._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
       (tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)this;
  local_e0 = input;
  iVar4 = UnionType::GetMemberCount(source);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,iVar4,
             (allocator_type *)&local_128);
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = iVar4;
  if (iVar4 != 0) {
    iVar4 = 0;
    do {
      source_00 = UnionType::GetMemberType(source,iVar4);
      l1 = UnionType::GetMemberName_abi_cxx11_(source,iVar4);
      index = 0;
      while( true ) {
        iVar5 = UnionType::GetMemberCount(target);
        if (iVar5 <= index) {
          local_90[0] = local_80;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,
                     "Type %s can\'t be cast as %s. The member \'%s\' is not present in target union"
                     ,"");
          LogicalType::ToString_abi_cxx11_(&local_50,source);
          LogicalType::ToString_abi_cxx11_(&local_70,target);
          pcVar1 = (l1->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar1,pcVar1 + l1->_M_string_length);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_128,(StringUtil *)local_90,&local_50,&local_70,&local_b0,in_R9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
          ConversionException::ConversionException(this_00,&local_128);
          __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        l2 = UnionType::GetMemberName_abi_cxx11_(target,index);
        bVar3 = StringUtil::CIEquals(l1,l2);
        if (bVar3) break;
        index = index + 1;
      }
      target_00 = UnionType::GetMemberType(target,index);
      pvVar6 = vector<unsigned_long,_true>::operator[](&local_d8,iVar4);
      *pvVar6 = index;
      local_c0.context.ptr = (local_e0->context).ptr;
      local_c0.query_location.index = (local_e0->query_location).index;
      CastFunctionSet::GetCastFunction
                ((BoundCastInfo *)&local_128,local_e0->function_set,source_00,target_00,&local_c0);
      ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::
      emplace_back<duckdb::BoundCastInfo>(&local_108,(BoundCastInfo *)&local_128);
      if ((long *)local_128.field_2._M_allocated_capacity != (long *)0x0) {
        (**(code **)(*(long *)local_128.field_2._M_allocated_capacity + 8))();
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != local_e8);
  }
  make_uniq<duckdb::UnionUnionBoundCastData,duckdb::vector<unsigned_long,true>&,duckdb::vector<duckdb::BoundCastInfo,true>,duckdb::LogicalType_const&>
            ((duckdb *)&local_128,&local_d8,(vector<duckdb::BoundCastInfo,_true> *)&local_108,target
            );
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
  super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl =
       local_f0._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  *(pointer *)
   local_f0._M_t.
   super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
   super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = local_128._M_dataplus._M_p;
  ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector(&local_108);
  if (local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundCastData> BindUnionToUnionCast(BindCastInput &input, const LogicalType &source,
                                               const LogicalType &target) {
	D_ASSERT(source.id() == LogicalTypeId::UNION);
	D_ASSERT(target.id() == LogicalTypeId::UNION);

	auto source_member_count = UnionType::GetMemberCount(source);

	auto tag_map = vector<idx_t>(source_member_count);
	auto member_casts = vector<BoundCastInfo>();

	for (idx_t source_idx = 0; source_idx < source_member_count; source_idx++) {
		auto &source_member_type = UnionType::GetMemberType(source, source_idx);
		auto &source_member_name = UnionType::GetMemberName(source, source_idx);

		bool found = false;
		for (idx_t target_idx = 0; target_idx < UnionType::GetMemberCount(target); target_idx++) {
			auto &target_member_name = UnionType::GetMemberName(target, target_idx);

			// found a matching member
			if (StringUtil::CIEquals(source_member_name, target_member_name)) {
				auto &target_member_type = UnionType::GetMemberType(target, target_idx);
				tag_map[source_idx] = target_idx;
				member_casts.push_back(input.GetCastFunction(source_member_type, target_member_type));
				found = true;
				break;
			}
		}
		if (!found) {
			// no matching member tag found in the target set
			auto message =
			    StringUtil::Format("Type %s can't be cast as %s. The member '%s' is not present in target union",
			                       source.ToString(), target.ToString(), source_member_name);
			throw ConversionException(message);
		}
	}

	return make_uniq<UnionUnionBoundCastData>(tag_map, std::move(member_casts), target);
}